

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_common.h
# Opt level: O3

int aom_get_qmlevel_allintra(int qindex,int first,int last)

{
  int iVar1;
  
  iVar1 = 10;
  if ((((0x28 < qindex) && (iVar1 = 9, 100 < (uint)qindex)) && (iVar1 = 8, 0xa0 < (uint)qindex)) &&
     ((iVar1 = 7, 200 < (uint)qindex && (iVar1 = 6, 0xdc < (uint)qindex)))) {
    iVar1 = ((uint)qindex < 0xf1) + 4;
  }
  if (iVar1 < last) {
    last = iVar1;
  }
  if (iVar1 < first) {
    last = first;
  }
  return last;
}

Assistant:

static inline int aom_get_qmlevel_allintra(int qindex, int first, int last) {
  int qm_level = 0;

  if (qindex <= 40) {
    qm_level = 10;
  } else if (qindex <= 100) {
    qm_level = 9;
  } else if (qindex <= 160) {
    qm_level = 8;
  } else if (qindex <= 200) {
    qm_level = 7;
  } else if (qindex <= 220) {
    qm_level = 6;
  } else if (qindex <= 240) {
    qm_level = 5;
  } else {
    qm_level = 4;
  }

  return clamp(qm_level, first, last);
}